

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::char_writer>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
           *this,align_spec *spec,char_writer *f)

{
  ulong uVar1;
  wchar_t wVar2;
  ulong uVar3;
  wchar_t wVar4;
  wchar_t __tmp;
  wchar_t *pwVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  wchar_t wVar11;
  ulong uVar12;
  wchar_t local_20 [2];
  
  uVar9 = (ulong)spec->width_;
  if (uVar9 < 2) {
    wVar2 = f->value;
    pwVar5 = *(wchar_t **)this;
    uVar9 = *(ulong *)(this + 0x10);
    *(ulong *)(this + 0x10) = uVar9 + 1;
    if (uVar9 < *(ulong *)(this + 8)) {
      *(wchar_t **)this = pwVar5 + 1;
    }
    else {
      pwVar5 = local_20;
    }
    *pwVar5 = wVar2;
  }
  else {
    wVar2 = spec->fill_;
    uVar1 = uVar9 - 1;
    if (spec->align_ == ALIGN_CENTER) {
      uVar7 = uVar1 >> 1;
      pwVar5 = *(wchar_t **)this;
      uVar3 = *(ulong *)(this + 8);
      uVar10 = *(ulong *)(this + 0x10);
      wVar11 = *(wchar_t *)(this + 0x18);
      uVar6 = uVar10;
      uVar12 = uVar7;
      if (spec->width_ != 2) {
        do {
          wVar4 = wVar2;
          if (uVar6 < uVar3) {
            *pwVar5 = wVar2;
            pwVar5 = pwVar5 + 1;
            wVar4 = wVar11;
          }
          wVar11 = wVar4;
          uVar12 = uVar12 - 1;
          uVar6 = uVar6 + 1;
        } while (uVar12 != 0);
        uVar10 = uVar10 + uVar7;
      }
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar3;
      *(ulong *)(this + 0x10) = uVar10;
      *(wchar_t *)(this + 0x18) = wVar11;
      wVar11 = f->value;
      *(ulong *)(this + 0x10) = uVar10 + 1;
      if (uVar10 < uVar3) {
        *(wchar_t **)this = pwVar5 + 1;
      }
      else {
        pwVar5 = local_20;
      }
      *pwVar5 = wVar11;
      pwVar5 = *(wchar_t **)this;
      uVar3 = *(ulong *)(this + 8);
      uVar10 = *(ulong *)(this + 0x10);
      wVar11 = *(wchar_t *)(this + 0x18);
      if (uVar1 - uVar7 != 0) {
        lVar8 = (uVar7 - uVar9) + 1;
        uVar9 = uVar10;
        do {
          wVar4 = wVar2;
          if (uVar9 < uVar3) {
            *pwVar5 = wVar2;
            pwVar5 = pwVar5 + 1;
            wVar4 = wVar11;
          }
          wVar11 = wVar4;
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
        uVar10 = uVar10 + (uVar1 - uVar7);
      }
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar3;
      *(ulong *)(this + 0x10) = uVar10;
      *(wchar_t *)(this + 0x18) = wVar11;
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      pwVar5 = *(wchar_t **)this;
      uVar3 = *(ulong *)(this + 8);
      uVar10 = *(ulong *)(this + 0x10);
      wVar11 = *(wchar_t *)(this + 0x18);
      uVar6 = uVar10;
      uVar12 = uVar1;
      do {
        wVar4 = wVar2;
        if (uVar6 < uVar3) {
          *pwVar5 = wVar2;
          pwVar5 = pwVar5 + 1;
          wVar4 = wVar11;
        }
        wVar11 = wVar4;
        uVar6 = uVar6 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar3;
      *(ulong *)(this + 0x10) = uVar1 + uVar10;
      *(wchar_t *)(this + 0x18) = wVar11;
      wVar2 = f->value;
      *(ulong *)(this + 0x10) = uVar9 + uVar10;
      if (uVar1 + uVar10 < uVar3) {
        *(wchar_t **)this = pwVar5 + 1;
      }
      else {
        pwVar5 = local_20;
      }
      *pwVar5 = wVar2;
    }
    else {
      wVar11 = f->value;
      pwVar5 = *(wchar_t **)this;
      uVar9 = *(ulong *)(this + 0x10);
      *(ulong *)(this + 0x10) = uVar9 + 1;
      if (uVar9 < *(ulong *)(this + 8)) {
        *(wchar_t **)this = pwVar5 + 1;
      }
      else {
        pwVar5 = local_20;
      }
      *pwVar5 = wVar11;
      pwVar5 = *(wchar_t **)this;
      uVar9 = *(ulong *)(this + 8);
      uVar3 = *(ulong *)(this + 0x10);
      wVar11 = *(wchar_t *)(this + 0x18);
      uVar10 = uVar3;
      uVar6 = uVar1;
      do {
        wVar4 = wVar2;
        if (uVar10 < uVar9) {
          *pwVar5 = wVar2;
          pwVar5 = pwVar5 + 1;
          wVar4 = wVar11;
        }
        wVar11 = wVar4;
        uVar10 = uVar10 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      *(wchar_t **)this = pwVar5;
      *(ulong *)(this + 8) = uVar9;
      *(ulong *)(this + 0x10) = uVar3 + uVar1;
      *(wchar_t *)(this + 0x18) = wVar11;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }